

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void idx2::GrowCapacity<idx2::t2<unsigned_int,idx2::channel*>>
               (array<idx2::t2<unsigned_int,_idx2::channel_*>_> *Array,i64 NewCapacity)

{
  byte *local_58;
  ulong uStack_50;
  allocator *local_48;
  buffer local_38;
  
  if (NewCapacity == 0) {
    NewCapacity = (Array->Capacity * 3) / 2 + 8;
  }
  if (Array->Capacity < NewCapacity) {
    if (Mallocator()::Instance == '\0') {
      GrowCapacity<idx2::t2<unsigned_int,idx2::channel*>>();
    }
    local_58 = (byte *)0x0;
    uStack_50 = 0;
    local_48 = (allocator *)&Mallocator()::Instance;
    (**Array->Alloc->_vptr_allocator)(Array->Alloc,&local_58,NewCapacity << 4);
    local_38.Alloc = local_48;
    local_38.Data = local_58;
    local_38.Bytes = uStack_50;
    MemCopy(&Array->Buffer,&local_38);
    (*Array->Alloc->_vptr_allocator[1])(Array->Alloc,Array);
    (Array->Buffer).Alloc = local_38.Alloc;
    (Array->Buffer).Data = local_38.Data;
    (Array->Buffer).Bytes = local_38.Bytes;
    Array->Capacity = (ulong)local_38.Bytes >> 4;
    Array->Capacity = NewCapacity;
  }
  return;
}

Assistant:

void
GrowCapacity(array<t>* Array, i64 NewCapacity)
{
  if (NewCapacity == 0) // default
    NewCapacity = Array->Capacity * 3 / 2 + 8;
  if (Array->Capacity < NewCapacity)
  {
    buffer Buf;
    Array->Alloc->Alloc(&Buf, NewCapacity * sizeof(t));
    idx2_Assert(Buf);
    Relocate(Array, Buf);
    Array->Capacity = NewCapacity;
  }
}